

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

Stream * rw::ps2::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  uint32 uVar4;
  Error in_RAX;
  undefined4 *puVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  FILE *__stream;
  Error _e;
  
  _e = in_RAX;
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    uVar4 = Stream::readU32(stream);
    if (uVar4 == 4) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 94"
      ;
      puVar5 = (undefined4 *)(*DAT_00145dd8)(0x10,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar5;
      *puVar5 = 4;
      uVar1 = *(ushort *)(*(long *)((long)object + 0x90) + 4);
      puVar5[1] = (uint)uVar1;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 99"
      ;
      uVar6 = (*DAT_00145dd8)((ulong)uVar1 << 5,0x3000f);
      *(undefined8 *)(puVar5 + 2) = uVar6;
      puVar11 = (undefined8 *)(*(long *)((long)object + 0x90) + 0x20);
      lVar12 = 0;
      for (uVar9 = 0; uVar9 < (uint)puVar5[1]; uVar9 = uVar9 + 1) {
        lVar2 = *(long *)(puVar5 + 2);
        Stream::read32(stream,&_e,8);
        *(uint32 *)(lVar2 + lVar12) = _e.plugin;
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 106"
        ;
        lVar7 = (*DAT_00145dd8)(_e.plugin + 0x7f,0x3000f);
        *(long *)(lVar2 + 8 + lVar12) = lVar7;
        uVar10 = lVar7 + 0x7fU & 0xffffffffffffff80;
        *(ulong *)(lVar2 + 0x10 + lVar12) = uVar10;
        (*stream->_vptr_Stream[4])(stream,uVar10,(ulong)*(uint *)(lVar2 + lVar12));
        *(undefined8 *)(lVar2 + 0x18 + lVar12) = *puVar11;
        lVar12 = lVar12 + 0x20;
        puVar11 = puVar11 + 3;
      }
      return stream;
    }
    _e.plugin = 2;
    _e.code = 0x80000006;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp"
            ,0x5b);
    __stream = _stderr;
    pcVar8 = dbgsprint(0x80000006,(ulong)uVar4);
  }
  else {
    _e.plugin = 2;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp"
            ,0x56);
    __stream = _stderr;
    pcVar8 = dbgsprint(0x80000004,"STRUCT");
  }
  fprintf(__stream,"%s\n",pcVar8);
  setError(&_e);
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_PS2){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_PS2;
	assert(geometry->meshHeader != nil);
	header->numMeshes = geometry->meshHeader->numMeshes;
	header->instanceMeshes = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	Mesh *m = geometry->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		stream->read32(buf, 8);
		instance->dataSize = buf[0];
		instance->dataRaw = rwNewT(uint8, instance->dataSize+0x7F, MEMDUR_EVENT | ID_GEOMETRY);
		instance->data = ALIGNPTR(instance->dataRaw, 0x80);
#ifdef RW_PS2
		uint32 a = (uint32)instance->data;
		assert(a % 0x10 == 0);
#endif
		stream->read8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
		instance->material = m->material;
//		sizedebug(instance);
		m++;
	}
	return stream;
}